

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintBuffer.cpp
# Opt level: O0

void __thiscall yb::PrintBuffer::PrintBuffer(PrintBuffer *this,size_t size)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  char *local_30 [3];
  size_t local_18;
  size_t size_local;
  PrintBuffer *this_local;
  
  local_18 = size;
  size_local = (size_t)this;
  std::__cxx11::string::string((string *)this);
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::__normal_iterator(&this->position_);
  std::__cxx11::string::reserve((ulong)this);
  local_38._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)local_30,&local_38);
  (this->position_)._M_current = local_30[0];
  return;
}

Assistant:

PrintBuffer::PrintBuffer(size_t size) {
    buffer_.reserve(size);
    position_ = buffer_.end();
}